

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O0

SQInteger __thiscall SQLexer::ProcessStringHexEscape(SQLexer *this,SQChar *dest,SQInteger maxdigits)

{
  bool bVar1;
  int iVar2;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  long in_RSI;
  long in_RDI;
  SQInteger n;
  SQChar *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  long local_20;
  
  Next((SQLexer *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0));
  *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 1;
  iVar2 = isxdigit((uint)*(byte *)(in_RDI + 0x60));
  if (iVar2 == 0) {
    Error((SQLexer *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
          in_stack_ffffffffffffffc8);
  }
  local_20 = 0;
  while( true ) {
    iVar2 = isxdigit((uint)*(byte *)(in_RDI + 0x60));
    bVar1 = local_20 < CONCAT71(in_register_00000011,in_DL);
    if (iVar2 == 0 || !bVar1) break;
    *(undefined1 *)(in_RSI + local_20) = *(undefined1 *)(in_RDI + 0x60);
    local_20 = local_20 + 1;
    Next((SQLexer *)CONCAT17(iVar2 != 0 && bVar1,in_stack_ffffffffffffffd0));
    *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 1;
  }
  *(undefined1 *)(in_RSI + local_20) = 0;
  return local_20;
}

Assistant:

SQInteger SQLexer::ProcessStringHexEscape(SQChar *dest, SQInteger maxdigits)
{
    NEXT();
    if (!isxdigit(CUR_CHAR)) Error(_SC("hexadecimal number expected"));
    SQInteger n = 0;
    while (isxdigit(CUR_CHAR) && n < maxdigits) {
        dest[n] = CUR_CHAR;
        n++;
        NEXT();
    }
    dest[n] = 0;
    return n;
}